

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Shift
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,double shiftX,double shiftY)

{
  uchar *puVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  imageException *this;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uchar *puVar14;
  uint uVar15;
  int iVar16;
  EVP_PKEY_CTX *src;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  uchar *__s;
  int iVar20;
  int iVar21;
  ulong __n;
  uint uVar22;
  size_t __n_00;
  uchar *puVar23;
  uchar *puVar24;
  uchar *__s_00;
  int iVar25;
  ulong uVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar30 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ImageTemplate<unsigned_char> local_58;
  
  auVar33 = in_ZMM4._0_16_;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  auVar29._8_8_ = in_XMM0_Qb;
  auVar29._0_8_ = shiftX;
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = shiftY;
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar29 = vandpd_avx512vl(auVar29,auVar5);
  auVar5 = vcvtusi2sd_avx512f(auVar33,width - 1);
  if (auVar29._0_8_ <= auVar5._0_8_) {
    auVar34._8_8_ = 0x7fffffffffffffff;
    auVar34._0_8_ = 0x7fffffffffffffff;
    auVar29 = vandpd_avx512vl(auVar6,auVar34);
    auVar5 = vcvtusi2sd_avx512f(auVar33,height - 1);
    if (auVar29._0_8_ <= auVar5._0_8_) {
      uVar8 = -(int)shiftX;
      uVar11 = -(int)shiftY;
      dVar27 = (double)(int)uVar8 + shiftX;
      auVar5 = SUB6416(ZEXT864(0),0);
      dVar28 = (double)(int)uVar11 + shiftY;
      uVar7 = ~(int)shiftX;
      if (dVar27 <= 0.0) {
        uVar7 = uVar8;
      }
      uVar8 = ~(int)shiftY;
      if (dVar28 <= 0.0) {
        uVar8 = uVar11;
      }
      uVar11 = -uVar7 - startXIn;
      if (-uVar7 < startXIn) {
        uVar11 = 0;
      }
      __n_00 = 0;
      if (0 < (int)uVar7) {
        uVar22 = width + startXIn + uVar7;
        uVar9 = in->_width - 1;
        __n_00 = (ulong)(uVar22 - uVar9);
        if (uVar22 < uVar9) {
          __n_00 = 0;
        }
      }
      iVar16 = 0;
      uVar9 = -uVar8 - startYIn;
      if (-uVar8 < startYIn) {
        uVar9 = 0;
      }
      uVar9 = (int)uVar8 >> 0x1f & uVar9;
      if ((0 < (int)uVar8) &&
         (uVar15 = height + startYIn + uVar8, uVar22 = in->_height - 1, iVar16 = uVar15 - uVar22,
         uVar15 < uVar22)) {
        iVar16 = 0;
      }
      puVar23 = in->_data;
      uVar22 = in->_rowSize;
      uVar17 = (ulong)uVar22;
      puVar1 = out->_data;
      uVar15 = out->_rowSize;
      uVar10 = (ulong)uVar15;
      uVar12 = (ulong)(uVar15 * uVar9);
      puVar24 = puVar1 + (ulong)(startYOut * uVar15) + (ulong)startXOut;
      __s_00 = puVar24;
      if (uVar15 * uVar9 != 0) {
        __s_00 = puVar24 + uVar12;
        uVar26 = 0;
        do {
          memset(puVar24 + uVar26,0,(ulong)width);
          uVar26 = uVar26 + uVar10;
        } while (uVar12 != uVar26);
        auVar5 = SUB6416(ZEXT864(0),0);
      }
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar28;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar27;
      uVar18 = ((height - uVar9) - iVar16) * uVar15;
      if (uVar18 != 0) {
        uVar2 = vcmpsd_avx512f(auVar36,auVar5 << 0x40,1);
        bVar3 = (bool)((byte)uVar2 & 1);
        uVar2 = vcmpsd_avx512f(auVar33,auVar5 << 0x40,1);
        bVar4 = (bool)((byte)uVar2 & 1);
        auVar33 = ZEXT816(0x3fe0000000000000);
        auVar34 = ZEXT816(0x40d0000000000000);
        uVar11 = (int)uVar7 >> 0x1f & uVar11;
        dVar27 = (double)((ulong)bVar3 * (long)(dVar27 + 1.0) + (ulong)!bVar3 * (long)dVar27);
        dVar28 = (double)((ulong)bVar4 * (long)(dVar28 + 1.0) + (ulong)!bVar4 * (long)dVar28);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dVar27 * dVar28;
        auVar5 = vfmadd213sd_fma(auVar32,auVar34,auVar33);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = (1.0 - dVar27) * dVar28;
        auVar29 = vfmadd213sd_fma(auVar35,auVar34,auVar33);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = (1.0 - dVar27) * (1.0 - dVar28);
        auVar6 = vfmadd213sd_fma(auVar31,auVar34,auVar33);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar27 * (1.0 - dVar28);
        auVar33 = vfmadd213sd_fma(auVar30,auVar34,auVar33);
        iVar20 = vcvttsd2usi_avx512f(auVar5);
        iVar21 = vcvttsd2usi_avx512f(auVar29);
        iVar19 = vcvttsd2usi_avx512f(auVar6);
        iVar25 = vcvttsd2usi_avx512f(auVar33);
        __n = (ulong)uVar11;
        lVar13 = (long)(int)(uVar8 * uVar22 + uVar7) + __n + (ulong)startXIn;
        uVar26 = (ulong)((width - uVar11) - (int)__n_00);
        puVar24 = puVar23 + lVar13 + (ulong)(startYIn * uVar22) + (ulong)(uVar9 * uVar22) + 1;
        puVar23 = puVar23 + startYIn * uVar22 + uVar17 + lVar13 + (ulong)(uVar9 * uVar22) + 1;
        puVar14 = __s_00 + uVar18;
        do {
          memset(__s_00,0,__n);
          __s = __s_00;
          if (__s_00 != __s_00 + uVar26 + __n) {
            lVar13 = 0;
            do {
              __s_00[lVar13] =
                   (uchar)((uint)puVar23[lVar13] * iVar19 + 0x2000 +
                           (uint)puVar24[lVar13] * iVar21 +
                           (uint)puVar23[lVar13 + -1] * iVar25 + (uint)puVar24[lVar13 + -1] * iVar20
                          >> 0xe);
              lVar13 = lVar13 + 1;
              __s = __s_00 + uVar26 + __n;
            } while (__n + uVar26 != lVar13);
          }
          memset(__s,0,__n_00);
          __s_00 = __s_00 + uVar10;
          puVar24 = puVar24 + uVar17;
          puVar23 = puVar23 + uVar17;
        } while (__s_00 != puVar14);
      }
      if (iVar16 * uVar15 != 0) {
        uVar17 = 0;
        do {
          memset(puVar1 + uVar17 + (ulong)startXOut + (ulong)(startYOut * uVar15) + uVar12 +
                                   (ulong)uVar18,0,(ulong)width);
          uVar17 = uVar17 + uVar10;
        } while (iVar16 * uVar15 != uVar17);
      }
      return;
    }
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Shift value by value bigger than ROI");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Shift( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                uint32_t width, uint32_t height, double shiftX, double shiftY )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if ( (fabs(shiftX) > width - 1) || (fabs(shiftY) > height - 1) )
            throw imageException("Shift value by value bigger than ROI");

        // take a note that we use an opposite values
        int32_t shiftXIntegral = -static_cast<int32_t>( shiftX );
        int32_t shiftYIntegral = -static_cast<int32_t>( shiftY );

        shiftX = shiftX + shiftXIntegral;
        shiftY = shiftY + shiftYIntegral;

        if ( shiftX > 0.0 )
            --shiftXIntegral;

        if ( shiftY > 0.0 )
            --shiftYIntegral;

        const double coeffX = ( shiftX < 0.0 ) ? (1.0 + shiftX) : shiftX;
        const double coeffY = ( shiftY < 0.0 ) ? (1.0 + shiftY) : shiftY;

        // 2^23 = 8388608, 2^23 * 256 is a integer limit
        const uint32_t coeff0 = static_cast<uint32_t>((      coeffX) * (      coeffY) * 16384 + 0.5);
        const uint32_t coeff1 = static_cast<uint32_t>((1.0 - coeffX) * (      coeffY) * 16384 + 0.5);
        const uint32_t coeff2 = static_cast<uint32_t>((1.0 - coeffX) * (1.0 - coeffY) * 16384 + 0.5);
        const uint32_t coeff3 = static_cast<uint32_t>((      coeffX) * (1.0 - coeffY) * 16384 + 0.5);

        const uint32_t limitX = in.width()  - 1u; // we need 2 subsequent pixels so we cannot use last pixel
        const uint32_t limitY = in.height() - 1u;

        const uint32_t emptyLeftArea  = (shiftXIntegral < 0 && startXIn < static_cast<uint32_t>(-shiftXIntegral)) ?
                                        (static_cast<uint32_t>(-shiftXIntegral) - startXIn) : 0u;
        const uint32_t emptyRightArea = (shiftXIntegral > 0 && limitX < startXIn + width + static_cast<uint32_t>(shiftXIntegral)) ?
                                        (startXIn + width + static_cast<uint32_t>(shiftXIntegral) - limitX) : 0u;
        const uint32_t realWidth = width - emptyLeftArea - emptyRightArea;

        const uint32_t emptyTopArea    = (shiftYIntegral < 0 && startYIn < static_cast<uint32_t>(-shiftYIntegral)) ?
                                         (static_cast<uint32_t>(-shiftYIntegral) - startYIn) : 0u;
        const uint32_t emptyBottomArea = (shiftYIntegral > 0 && limitY < startYIn + height + static_cast<uint32_t>(shiftYIntegral)) ?
                                         (startYIn + height + static_cast<uint32_t>(shiftYIntegral) - limitY) : 0u;
        const uint32_t realHeight = height - emptyTopArea - emptyBottomArea;

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        inY += shiftXIntegral + shiftYIntegral * static_cast<int32_t>( rowSizeIn );

        const uint8_t * outYEnd = outY + emptyTopArea * rowSizeOut;
        for( ; outY != outYEnd; outY+=rowSizeOut )
            memset( outY, 0, width );

        inY += emptyTopArea * rowSizeIn;

        outYEnd = outY + realHeight * rowSizeOut;
        for( ; outY != outYEnd; outY+=rowSizeOut, inY+=rowSizeIn ) {
            const uint8_t * inX = inY;
            uint8_t * outX = outY;
            const uint8_t * outXEnd = outX + emptyLeftArea + realWidth;

            memset( outX, 0, emptyLeftArea );
            inX += emptyLeftArea;

            for( ; outX != outXEnd; ++outX ) {
                uint32_t data  = (*(inX))  * coeff0;
                data += (*(inX+rowSizeIn)) * coeff3;
                data += (*(++inX))         * coeff1; // here we increment inX
                data += (*(inX+rowSizeIn)) * coeff2;

                *outX = static_cast<uint8_t>((data + 8192) >> 14); // 8192 is 0.5 after calculations
            }

            memset( outX, 0, emptyRightArea );
        }

        outYEnd = outY + emptyBottomArea * rowSizeOut;
        for( ; outY != outYEnd; outY+=rowSizeOut )
            memset( outY, 0, width );
    }